

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall
InterpGCTest_Collect_InstanceExport_Test::InterpGCTest_Collect_InstanceExport_Test
          (InterpGCTest_Collect_InstanceExport_Test *this)

{
  Features local_18;
  
  testing::Test::Test((Test *)this);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_002ce910;
  local_18.exceptions_enabled_ = false;
  local_18.mutable_globals_enabled_ = true;
  local_18.sat_float_to_int_enabled_ = true;
  local_18.sign_extension_enabled_ = true;
  local_18.simd_enabled_ = false;
  local_18.threads_enabled_ = false;
  local_18.multi_value_enabled_ = true;
  local_18.tail_call_enabled_ = false;
  local_18.bulk_memory_enabled_ = false;
  local_18.reference_types_enabled_ = false;
  local_18.annotations_enabled_ = false;
  local_18.gc_enabled_ = false;
  local_18.memory64_enabled_ = false;
  wabt::interp::Store::Store(&(this->super_InterpGCTest).super_InterpTest.store_,&local_18);
  memset(&(this->super_InterpGCTest).super_InterpTest.module_desc_,0,0x150);
  (this->super_InterpGCTest).super_InterpTest.super_Test._vptr_Test =
       (_func_int **)&PTR__InterpTest_002ce7c8;
  return;
}

Assistant:

TEST_F(InterpGCTest, Collect_InstanceExport) {
  // (func (export "f"))
  // (global (export "g") i32 (i32.const 0))
  // (table (export "t") 0 funcref)
  // (memory (export "m") 0)
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x04, 0x01,
      0x60, 0x00, 0x00, 0x03, 0x02, 0x01, 0x00, 0x04, 0x04, 0x01, 0x70,
      0x00, 0x00, 0x05, 0x03, 0x01, 0x00, 0x00, 0x06, 0x06, 0x01, 0x7f,
      0x00, 0x41, 0x00, 0x0b, 0x07, 0x11, 0x04, 0x01, 0x66, 0x00, 0x00,
      0x01, 0x67, 0x03, 0x00, 0x01, 0x74, 0x01, 0x00, 0x01, 0x6d, 0x02,
      0x00, 0x0a, 0x04, 0x01, 0x02, 0x00, 0x0b,
  });
  Instantiate();
  auto after_new = store_.object_count();
  EXPECT_EQ(before_new + 6, after_new);  // module, instance, f, t, m, g

  // Instance keeps all exports alive.
  store_.Collect();
  EXPECT_EQ(after_new, store_.object_count());
}